

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

iterator __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::find(sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       *this,DiagCode *key)

{
  DiagCode DVar1;
  EntryPointer psVar2;
  int8_t distance;
  char cVar3;
  
  psVar2 = this->entries +
           ((ulong)CONCAT22(key->subsystem,key->code) * -0x61c8864680b583eb >>
           ((this->hash_policy).shift & 0x3fU));
  cVar3 = '\0';
  while( true ) {
    if (psVar2->distance_from_desired < cVar3) {
      return (iterator)(this->entries + this->num_slots_minus_one + (long)this->max_lookups);
    }
    DVar1 = (psVar2->field_1).value.first;
    if (key->subsystem == DVar1.subsystem && (uint)DVar1 >> 0x10 == (uint)key->code) break;
    cVar3 = cVar3 + '\x01';
    psVar2 = psVar2 + 1;
  }
  return (iterator)psVar2;
}

Assistant:

size_t operator()(const slang::DiagCode& dc) const {
        return (((size_t)dc.getSubsystem()) << 16) | dc.getCode();
    }